

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O2

MATCH_RESULT llbuild::basic::sys::filenameMatch(string *pattern,string *filename)

{
  MATCH_RESULT MVar1;
  
  MVar1 = fnmatch((pattern->_M_dataplus)._M_p,(filename->_M_dataplus)._M_p,0);
  if (MVar1 != MATCH) {
    MVar1 = (MVar1 != NO_MATCH) + NO_MATCH;
  }
  return MVar1;
}

Assistant:

sys::MATCH_RESULT sys::filenameMatch(const std::string& pattern,
                                     const std::string& filename) {
#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> wpattern;
  llvm::SmallVector<llvm::UTF16, 20> wfilename;

  llvm::convertUTF8ToUTF16String(pattern, wpattern);
  llvm::convertUTF8ToUTF16String(filename, wfilename);

  bool result =
      PathMatchSpecW((LPCWSTR)wfilename.data(), (LPCWSTR)wpattern.data());
  return result ? sys::MATCH : sys::NO_MATCH;
#else
  int result = fnmatch(pattern.c_str(), filename.c_str(), 0);
  return result == 0 ? sys::MATCH
                     : result == FNM_NOMATCH ? sys::NO_MATCH : sys::MATCH_ERROR;
#endif
}